

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

player_t * __thiscall player_t::operator=(player_t *this,player_t *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  long lVar11;
  
  this->mo = p->mo;
  this->playerstate = p->playerstate;
  uVar4 = *(undefined2 *)&(p->cmd).field_0x12;
  (this->cmd).consistancy = (p->cmd).consistancy;
  *(undefined2 *)&(this->cmd).field_0x12 = uVar4;
  sVar5 = (p->cmd).ucmd.pitch;
  sVar6 = (p->cmd).ucmd.yaw;
  sVar7 = (p->cmd).ucmd.roll;
  sVar8 = (p->cmd).ucmd.forwardmove;
  sVar9 = (p->cmd).ucmd.sidemove;
  sVar10 = (p->cmd).ucmd.upmove;
  (this->cmd).ucmd.buttons = (p->cmd).ucmd.buttons;
  (this->cmd).ucmd.pitch = sVar5;
  (this->cmd).ucmd.yaw = sVar6;
  (this->cmd).ucmd.roll = sVar7;
  (this->cmd).ucmd.forwardmove = sVar8;
  (this->cmd).ucmd.sidemove = sVar9;
  (this->cmd).ucmd.upmove = sVar10;
  sVar5 = (p->original_cmd).pitch;
  sVar6 = (p->original_cmd).yaw;
  sVar7 = (p->original_cmd).roll;
  sVar8 = (p->original_cmd).forwardmove;
  sVar9 = (p->original_cmd).sidemove;
  sVar10 = (p->original_cmd).upmove;
  (this->original_cmd).buttons = (p->original_cmd).buttons;
  (this->original_cmd).pitch = sVar5;
  (this->original_cmd).yaw = sVar6;
  (this->original_cmd).roll = sVar7;
  (this->original_cmd).forwardmove = sVar8;
  (this->original_cmd).sidemove = sVar9;
  (this->original_cmd).upmove = sVar10;
  this->original_oldbuttons = p->original_oldbuttons;
  this->cls = p->cls;
  this->DesiredFOV = p->DesiredFOV;
  this->FOV = p->FOV;
  this->viewz = p->viewz;
  this->viewheight = p->viewheight;
  this->deltaviewheight = p->deltaviewheight;
  this->bob = p->bob;
  (this->Vel).Y = (p->Vel).Y;
  (this->Vel).X = (p->Vel).X;
  this->centering = p->centering;
  this->turnticks = p->turnticks;
  this->attackdown = p->attackdown;
  this->usedown = p->usedown;
  this->oldbuttons = p->oldbuttons;
  this->health = p->health;
  this->inventorytics = p->inventorytics;
  this->CurrentPlayerClass = p->CurrentPlayerClass;
  uVar1 = *(undefined8 *)(p->frags + 2);
  uVar2 = *(undefined8 *)(p->frags + 4);
  uVar3 = *(undefined8 *)(p->frags + 6);
  *(undefined8 *)this->frags = *(undefined8 *)p->frags;
  *(undefined8 *)(this->frags + 2) = uVar1;
  *(undefined8 *)(this->frags + 4) = uVar2;
  *(undefined8 *)(this->frags + 6) = uVar3;
  this->fragcount = p->fragcount;
  this->lastkilltime = p->lastkilltime;
  this->multicount = p->multicount;
  this->spreecount = p->spreecount;
  this->WeaponState = p->WeaponState;
  this->ReadyWeapon = p->ReadyWeapon;
  this->PendingWeapon = p->PendingWeapon;
  this->cheats = p->cheats;
  this->timefreezer = p->timefreezer;
  this->refire = p->refire;
  this->inconsistant = p->inconsistant;
  this->waiting = p->waiting;
  this->killcount = p->killcount;
  this->itemcount = p->itemcount;
  this->secretcount = p->secretcount;
  this->damagecount = p->damagecount;
  this->bonuscount = p->bonuscount;
  this->hazardcount = p->hazardcount;
  (this->hazardtype).Index = (p->hazardtype).Index;
  this->hazardinterval = p->hazardinterval;
  this->poisoncount = p->poisoncount;
  (this->poisontype).Index = (p->poisontype).Index;
  (this->poisonpaintype).Index = (p->poisonpaintype).Index;
  (this->poisoner).field_0 = (p->poisoner).field_0;
  (this->attacker).field_0 = (p->attacker).field_0;
  this->extralight = p->extralight;
  this->fixedcolormap = p->fixedcolormap;
  this->fixedlightlevel = p->fixedlightlevel;
  (this->psprites).field_0 = (p->psprites).field_0;
  this->morphTics = p->morphTics;
  this->MorphedPlayerClass = p->MorphedPlayerClass;
  this->MorphStyle = p->MorphStyle;
  this->MorphExitFlash = p->MorphExitFlash;
  (this->PremorphWeapon).field_0 = (p->PremorphWeapon).field_0;
  this->chickenPeck = p->chickenPeck;
  this->jumpTics = p->jumpTics;
  this->onground = p->onground;
  this->respawn_time = p->respawn_time;
  (this->camera).field_0 = (p->camera).field_0;
  this->air_finished = p->air_finished;
  (this->LastDamageType).Index = (p->LastDamageType).Index;
  (this->Bot).field_0 = (p->Bot).field_0;
  this->settings_controller = p->settings_controller;
  this->BlendR = p->BlendR;
  this->BlendG = p->BlendG;
  this->BlendB = p->BlendB;
  this->BlendA = p->BlendA;
  FString::operator=(&this->LogText,&p->LogText);
  (this->MinPitch).Degrees = (p->MinPitch).Degrees;
  (this->MaxPitch).Degrees = (p->MaxPitch).Degrees;
  this->crouching = p->crouching;
  this->crouchdir = p->crouchdir;
  this->crouchfactor = p->crouchfactor;
  this->crouchoffset = p->crouchoffset;
  this->crouchviewdelta = p->crouchviewdelta;
  lVar11 = 0x1e0;
  do {
    TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::operator=
              ((TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *)
               ((long)&this->mo + lVar11),
               (TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *)((long)&p->mo + lVar11));
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x280);
  (this->ConversationNPC).field_0 = (p->ConversationNPC).field_0;
  (this->ConversationPC).field_0 = (p->ConversationPC).field_0;
  (this->ConversationNPCAngle).Degrees = (p->ConversationNPCAngle).Degrees;
  this->ConversationFaceTalker = p->ConversationFaceTalker;
  (this->MUSINFOactor).field_0 = (p->MUSINFOactor).field_0;
  this->MUSINFOtics = p->MUSINFOtics;
  return this;
}

Assistant:

player_t &player_t::operator=(const player_t &p)
{
	mo = p.mo;
	playerstate = p.playerstate;
	cmd = p.cmd;
	original_cmd = p.original_cmd;
	original_oldbuttons = p.original_oldbuttons;
	// Intentionally not copying userinfo!
	cls = p.cls;
	DesiredFOV = p.DesiredFOV;
	FOV = p.FOV;
	viewz = p.viewz;
	viewheight = p.viewheight;
	deltaviewheight = p.deltaviewheight;
	bob = p.bob;
	Vel = p.Vel;
	centering = p.centering;
	turnticks = p.turnticks;
	attackdown = p.attackdown;
	usedown = p.usedown;
	oldbuttons = p.oldbuttons;
	health = p.health;
	inventorytics = p.inventorytics;
	CurrentPlayerClass = p.CurrentPlayerClass;
	memcpy(frags, &p.frags, sizeof(frags));
	fragcount = p.fragcount;
	lastkilltime = p.lastkilltime;
	multicount = p.multicount;
	spreecount = p.spreecount;
	WeaponState = p.WeaponState;
	ReadyWeapon = p.ReadyWeapon;
	PendingWeapon = p.PendingWeapon;
	cheats = p.cheats;
	timefreezer = p.timefreezer;
	refire = p.refire;
	inconsistant = p.inconsistant;
	waiting = p.waiting;
	killcount = p.killcount;
	itemcount = p.itemcount;
	secretcount = p.secretcount;
	damagecount = p.damagecount;
	bonuscount = p.bonuscount;
	hazardcount = p.hazardcount;
	hazardtype = p.hazardtype;
	hazardinterval = p.hazardinterval;
	poisoncount = p.poisoncount;
	poisontype = p.poisontype;
	poisonpaintype = p.poisonpaintype;
	poisoner = p.poisoner;
	attacker = p.attacker;
	extralight = p.extralight;
	fixedcolormap = p.fixedcolormap;
	fixedlightlevel = p.fixedlightlevel;
	psprites = p.psprites;
	morphTics = p.morphTics;
	MorphedPlayerClass = p.MorphedPlayerClass;
	MorphStyle = p.MorphStyle;
	MorphExitFlash = p.MorphExitFlash;
	PremorphWeapon = p.PremorphWeapon;
	chickenPeck = p.chickenPeck;
	jumpTics = p.jumpTics;
	onground = p.onground;
	respawn_time = p.respawn_time;
	camera = p.camera;
	air_finished = p.air_finished;
	LastDamageType = p.LastDamageType;
	Bot = p.Bot;
	settings_controller = p.settings_controller;
	BlendR = p.BlendR;
	BlendG = p.BlendG;
	BlendB = p.BlendB;
	BlendA = p.BlendA;
	LogText = p.LogText;
	MinPitch = p.MinPitch;
	MaxPitch = p.MaxPitch;
	crouching = p.crouching;
	crouchdir = p.crouchdir;
	crouchfactor = p.crouchfactor;
	crouchoffset = p.crouchoffset;
	crouchviewdelta = p.crouchviewdelta;
	weapons = p.weapons;
	ConversationNPC = p.ConversationNPC;
	ConversationPC = p.ConversationPC;
	ConversationNPCAngle = p.ConversationNPCAngle;
	ConversationFaceTalker = p.ConversationFaceTalker;
	MUSINFOactor = p.MUSINFOactor;
	MUSINFOtics = p.MUSINFOtics;
	return *this;
}